

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O0

void __thiscall binlog::Range::throw_if_overflow(Range *this,size_t s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long in_RSI;
  Range *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_30 [48];
  
  if (in_RDI->_end < in_RDI->_begin + in_RSI) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff58);
    std::operator+((char *)__lhs,in_stack_ffffffffffffff20);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff20);
    size(in_RDI);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_30);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void throw_if_overflow(std::size_t s) const
  {
    if (_begin + s > _end)
    {
      throw std::runtime_error(
        "Range overflow " + std::to_string(s) + " > "
                          + std::to_string(size())
      );
    }
  }